

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O1

void Vec_IntPushOrderAbs(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  uVar4 = p->nSize;
  if (0 < (long)(int)uVar4) {
    lVar5 = 0;
    do {
      if (p->pArray[lVar5] == Entry) {
        __assert_fail("Entry != p->pArray[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                      ,0xd4,"void Vec_IntPushOrderAbs(Vec_Int_t *, int)");
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar4 != lVar5);
  }
  uVar1 = p->nCap;
  if (uVar4 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar1 * 2;
      if (iVar7 <= (int)uVar1) goto LAB_0066bc56;
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar1 << 3);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,(ulong)uVar1 << 3);
      }
      p->pArray = piVar3;
    }
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = iVar7;
  }
LAB_0066bc56:
  lVar5 = (long)p->nSize;
  p->nSize = p->nSize + 1;
  if (0 < lVar5) {
    piVar3 = p->pArray;
    uVar4 = -Entry;
    if (0 < Entry) {
      uVar4 = Entry;
    }
    do {
      uVar1 = piVar3[lVar5 + -1];
      uVar6 = -uVar1;
      if (0 < (int)uVar1) {
        uVar6 = uVar1;
      }
      if (uVar4 <= uVar6) goto LAB_0066bc92;
      piVar3[lVar5] = uVar1;
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
    lVar5 = 0;
  }
LAB_0066bc92:
  p->pArray[(int)lVar5] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrderAbs( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        assert( Entry != p->pArray[i] );
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( Abc_AbsInt(p->pArray[i]) < Abc_AbsInt(Entry) )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}